

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

bool wasm::
     CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
     ::isReturnCall(Expression *curr)

{
  Id IVar1;
  Call *pCVar2;
  CallIndirect *pCVar3;
  CallRef *pCVar4;
  Expression *curr_local;
  
  IVar1 = curr->_id;
  if (IVar1 == CallId) {
    pCVar2 = Expression::cast<wasm::Call>(curr);
    curr_local._7_1_ = (bool)(pCVar2->isReturn & 1);
  }
  else if (IVar1 == CallIndirectId) {
    pCVar3 = Expression::cast<wasm::CallIndirect>(curr);
    curr_local._7_1_ = (bool)(pCVar3->isReturn & 1);
  }
  else {
    if (IVar1 != CallRefId) {
      handle_unreachable("not a call",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                         ,0x1d5);
    }
    pCVar4 = Expression::cast<wasm::CallRef>(curr);
    curr_local._7_1_ = (bool)(pCVar4->isReturn & 1);
  }
  return curr_local._7_1_;
}

Assistant:

static bool isReturnCall(Expression* curr) {
    switch (curr->_id) {
      case Expression::Id::CallId:
        return curr->cast<Call>()->isReturn;
      case Expression::Id::CallIndirectId:
        return curr->cast<CallIndirect>()->isReturn;
      case Expression::Id::CallRefId:
        return curr->cast<CallRef>()->isReturn;
      default:
        WASM_UNREACHABLE("not a call");
    }
  }